

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

void __thiscall
GeneticAlgorithm::initializePopulation(GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  shared_ptr<std::vector<Individual,_std::allocator<Individual>_>_> *this_00;
  vector<Individual,_std::allocator<Individual>_> *pvVar1;
  int iVar2;
  Greedy greedy;
  Result greedyResult;
  Result lptfResult;
  LongestProcessingTimeFirst lptf;
  Greedy local_f8;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_d0;
  Result local_c0;
  Result local_90;
  LongestProcessingTimeFirst local_60;
  Individual local_58;
  
  std::make_shared<std::vector<Individual,std::allocator<Individual>>>();
  this_00 = &this->population;
  std::
  __shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&this_00->
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
              *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90.Cores.super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
              super__Vector_impl_data._M_finish);
  for (iVar2 = 0; iVar2 < this->destinatedPopulationSize + -2; iVar2 = iVar2 + 1) {
    pvVar1 = (this_00->
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
    Individual::makeRandom((Individual *)&local_90,(shared_ptr<Instance> *)&local_d0);
    std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>
              (pvVar1,(Individual *)&local_90);
    Individual::~Individual((Individual *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  }
  local_60.super_Greedy.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (Greedy)&PTR__AbstractAlgorithm_00109cd0;
  local_f8.super_AbstractAlgorithm._vptr_AbstractAlgorithm =
       (AbstractAlgorithm)&PTR__AbstractAlgorithm_00109c90;
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  LongestProcessingTimeFirst::operator()(&local_90,&local_60,(shared_ptr<Instance> *)&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  pvVar1 = (this_00->
           super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  Individual::Individual((Individual *)&local_c0,&local_90);
  std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>
            (pvVar1,(Individual *)&local_c0);
  Individual::~Individual((Individual *)&local_c0);
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,&instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>);
  Greedy::operator()(&local_c0,&local_f8,(shared_ptr<Instance> *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  pvVar1 = (this_00->
           super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  Individual::Individual(&local_58,&local_c0);
  std::vector<Individual,_std::allocator<Individual>_>::emplace_back<Individual>(pvVar1,&local_58);
  Individual::~Individual(&local_58);
  Result::~Result(&local_c0);
  Result::~Result(&local_90);
  return;
}

Assistant:

void GeneticAlgorithm::initializePopulation(std::shared_ptr<Instance> instance){
	population = std::make_shared<vector<Individual>>();

	for(int i = 0; i < destinatedPopulationSize-2; i++){
		population->push_back(Individual::makeRandom(instance));
	}

	LongestProcessingTimeFirst lptf;
	Greedy greedy;
	auto lptfResult = lptf(instance);
	population->push_back( (Individual)lptfResult );
	auto greedyResult = greedy(instance);
	population->push_back( (Individual)greedyResult );
}